

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinematic_chain.c
# Opt level: O3

void kca_fak(kca_joint *joint,ga_acc_twist *xdd)

{
  frame *pfVar1;
  
  if (joint == (kca_joint *)0x0) {
    __assert_fail("joint",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0x29,"void kca_fak(const struct kca_joint *, struct ga_acc_twist *)");
  }
  if (xdd != (ga_acc_twist *)0x0) {
    xdd->target_body = joint->target_body;
    xdd->reference_body = joint->reference_body;
    pfVar1 = joint->target_frame;
    xdd->point = pfVar1->origin;
    xdd->frame = pfVar1;
    return;
  }
  __assert_fail("xdd",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                ,0x2a,"void kca_fak(const struct kca_joint *, struct ga_acc_twist *)");
}

Assistant:

void kca_fak(
        const struct kca_joint *joint,
        struct ga_acc_twist *xdd)
{
    assert(joint);
    assert(xdd);

    xdd->target_body = joint->target_body;
    xdd->reference_body = joint->reference_body;
    xdd->point = joint->target_frame->origin;
    xdd->frame = joint->target_frame;
}